

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O3

void __thiscall RSTARPlanner::InitializeSearchStateInfo(RSTARPlanner *this,RSTARState *state)

{
  RSTARSearchStateSpace_t *pRVar1;
  CMDPSTATE *pCVar2;
  DiscreteSpaceInformation *pDVar3;
  pointer ppCVar4;
  int iVar5;
  CMDPSTATE *pCVar6;
  
  state->g = 1000000000;
  state->iterationclosed = 0;
  pRVar1 = this->pSearchStateSpace;
  state->callnumberaccessed = pRVar1->callnumber;
  (state->super_AbstractSearchState).heapindex = 0;
  state->bestpredaction = (CMDPACTION *)0x0;
  pCVar2 = pRVar1->searchgoalstate;
  if (pCVar2 == (CMDPSTATE *)0x0) {
    iVar5 = 0;
  }
  else {
    pDVar3 = (this->super_SBPLPlanner).environment_;
    pCVar6 = state->MDPstate;
    if (this->bforwardsearch != false) {
      pCVar6 = pCVar2;
      pCVar2 = state->MDPstate;
    }
    iVar5 = (*pDVar3->_vptr_DiscreteSpaceInformation[2])
                      (pDVar3,(ulong)(uint)pCVar2->StateID,(ulong)(uint)pCVar6->StateID);
  }
  state->h = iVar5;
  ppCVar4 = (state->predactionV).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((state->predactionV).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar4) {
    (state->predactionV).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar4;
  }
  return;
}

Assistant:

void RSTARPlanner::InitializeSearchStateInfo(RSTARState* state)
{
    state->g = INFINITECOST;
    state->iterationclosed = 0;
    state->callnumberaccessed = pSearchStateSpace->callnumber;
    state->heapindex = 0;
    state->bestpredaction = NULL;

    //compute heuristics
#if USE_HEUR
    if(pSearchStateSpace->searchgoalstate != NULL)
    state->h = ComputeHeuristic(state->MDPstate);
    else
    state->h = 0;
#else
    state->h = 0;
#endif

    state->predactionV.clear();
}